

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormat::setPadCharacter(DecimalFormat *this,UnicodeString *padChar)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  UChar32 ch;
  UnicodeString local_50;
  
  UVar2 = UnicodeString::operator==
                    (padChar,&((this->fields->properties).
                               super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>
                              .ptr)->padString);
  if (UVar2 == '\0') {
    sVar1 = (padChar->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (padChar->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 < 1) {
      UnicodeString::setToBogus
                (&((this->fields->properties).
                   super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                  padString);
    }
    else {
      ch = UnicodeString::char32At(padChar,0);
      UnicodeString::UnicodeString(&local_50,ch);
      UnicodeString::moveFrom
                (&((this->fields->properties).
                   super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                  padString,&local_50);
      UnicodeString::~UnicodeString(&local_50);
    }
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setPadCharacter(const UnicodeString& padChar) {
    if (padChar == fields->properties->padString) { return; }
    if (padChar.length() > 0) {
        fields->properties->padString = UnicodeString(padChar.char32At(0));
    } else {
        fields->properties->padString.setToBogus();
    }
    touchNoError();
}